

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_utils.c
# Opt level: O0

greatest_test_res file_utils_list_files_3_nodir(void)

{
  uint uVar1;
  int file_count;
  char **files;
  
  uVar1 = list_txt_files("../tests/data/dir_not_found",(char ***)&stack0xffffffffffffffe8);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (uVar1 == 0xffffffff) {
    greatest_info.msg = (char *)0x0;
    files._4_4_ = GREATEST_TEST_RES_PASS;
  }
  else {
    fprintf(_stdout,"\nExpected: ");
    fprintf(_stdout,"%i",0xffffffff);
    fprintf(_stdout,"\n     Got: ");
    fprintf(_stdout,"%i",(ulong)uVar1);
    fprintf(_stdout,"\n");
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
    ;
    greatest_info.fail_line = 0x12d;
    greatest_info.msg = "-1 != file_count";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    files._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  return files._4_4_;
}

Assistant:

TEST file_utils_list_files_3_nodir(void) {
    char **files;
    int file_count = list_txt_files("../tests/data/dir_not_found", &files);

    ASSERT_EQ_FMT(-1, file_count, "%i");
    if (file_count > -1)
        free_cstr_arr(files, file_count);
    PASS();
}